

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineInterfaceObject.cpp
# Opt level: O3

Var Js::EngineInterfaceObject::Entry_TagPublicLibraryCode
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var pvVar4;
  ScriptFunction *scriptFunction;
  JavascriptString *displayName;
  JavascriptBoolean *pJVar5;
  uint uVar6;
  uint in_stack_00000010;
  Var in_stack_00000020;
  Var in_stack_00000028;
  undefined1 local_30 [8];
  Arguments args;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  uVar6 = callInfo._0_4_;
  if (in_stack_00000010 != uVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                ,0x162,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) goto LAB_00b436e2;
    *puVar3 = 0;
  }
  args.Info = (Type)&stack0x00000018;
  local_30 = (undefined1  [8])callInfo;
  if ((uVar6 >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                ,0x162,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) goto LAB_00b436e2;
    *puVar3 = 0;
  }
  if (((ulong)callInfo & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                ,0x162,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar2) goto LAB_00b436e2;
    *puVar3 = 0;
  }
  if ((uVar6 & 0xffffff) - 3 < 2) {
    bVar2 = VarIs<Js::ScriptFunction>(in_stack_00000020);
    if (!bVar2) goto LAB_00b435b1;
    bVar2 = VarIs<Js::JavascriptString>(in_stack_00000028);
    if (!bVar2) goto LAB_00b435b1;
  }
  else {
LAB_00b435b1:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                ,0x165,
                                "((args.Info.Count == 3 || args.Info.Count == 4) && VarIs<ScriptFunction>(args.Values[1]) && VarIs<JavascriptString>(args.Values[2]))"
                                ,
                                "(args.Info.Count == 3 || args.Info.Count == 4) && VarIs<ScriptFunction>(args.Values[1]) && VarIs<JavascriptString>(args.Values[2])"
                               );
    if (!bVar2) goto LAB_00b436e2;
    *puVar3 = 0;
  }
  pvVar4 = Arguments::operator[]((Arguments *)local_30,1);
  scriptFunction = UnsafeVarTo<Js::ScriptFunction>(pvVar4);
  pvVar4 = Arguments::operator[]((Arguments *)local_30,2);
  displayName = UnsafeVarTo<Js::JavascriptString>(pvVar4);
  bVar2 = true;
  if ((local_30._0_4_ & 0xffffff) == 4) {
    bVar2 = VarIs<Js::JavascriptBoolean>(*(Var *)((long)args.Info + 0x18));
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                  ,0x16d,"(VarIs<JavascriptBoolean>(args.Values[3]))",
                                  "VarIs<JavascriptBoolean>(args.Values[3])");
      if (!bVar2) {
LAB_00b436e2:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    pJVar5 = UnsafeVarTo<Js::JavascriptBoolean>(*(Var *)((long)args.Info + 0x18));
    bVar2 = pJVar5->value != 0;
  }
  CreateLibraryCodeScriptFunction(scriptFunction,displayName,bVar2,false,true);
  return scriptFunction;
}

Assistant:

Var EngineInterfaceObject::Entry_TagPublicLibraryCode(RecyclableObject *function, CallInfo callInfo, ...)
    {
#pragma warning(push)
#pragma warning(disable: 4189) // 'scriptContext': local variable is initialized but not referenced
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
#pragma warning(pop)

        AssertOrFailFast((args.Info.Count == 3 || args.Info.Count == 4) && VarIs<ScriptFunction>(args.Values[1]) && VarIs<JavascriptString>(args.Values[2]));

        ScriptFunction *func = UnsafeVarTo<ScriptFunction>(args[1]);
        JavascriptString *methodName = UnsafeVarTo<JavascriptString>(args[2]);

        bool isConstructor = true;
        if (args.Info.Count == 4)
        {
            AssertOrFailFast(VarIs<JavascriptBoolean>(args.Values[3]));
            isConstructor = UnsafeVarTo<JavascriptBoolean>(args.Values[3])->GetValue();
        }

        // isConstructor = true is the default (when no 3rd arg is provided)
        return CreateLibraryCodeScriptFunction(func, methodName, isConstructor, false /* isJsBuiltIn */, true /* isPublic */);
    }